

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.hpp
# Opt level: O0

int __thiscall helics::LogManager::getMaxLevel(LogManager *this)

{
  long in_RDI;
  memory_order __b;
  
  CLI::std::operator&(seq_cst,__memory_order_mask);
  return *(int *)(in_RDI + 0x20);
}

Assistant:

int getMaxLevel() const { return maxLogLevel.load(); }